

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

integerPart __thiscall
llvm::detail::IEEEFloat::subtractSignificand(IEEEFloat *this,IEEEFloat *rhs,integerPart borrow)

{
  uint parts_00;
  integerPart *dst;
  integerPart *rhs_00;
  WordType WVar1;
  integerPart *parts;
  integerPart borrow_local;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  dst = significandParts(this);
  if (this->semantics != rhs->semantics) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x3a5,
                  "IEEEFloat::integerPart llvm::detail::IEEEFloat::subtractSignificand(const IEEEFloat &, integerPart)"
                 );
  }
  if (this->exponent == rhs->exponent) {
    rhs_00 = significandParts(rhs);
    parts_00 = partCount(this);
    WVar1 = APInt::tcSubtract(dst,rhs_00,borrow,parts_00);
    return WVar1;
  }
  __assert_fail("exponent == rhs.exponent",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x3a6,
                "IEEEFloat::integerPart llvm::detail::IEEEFloat::subtractSignificand(const IEEEFloat &, integerPart)"
               );
}

Assistant:

IEEEFloat::integerPart IEEEFloat::subtractSignificand(const IEEEFloat &rhs,
                                                      integerPart borrow) {
  integerPart *parts;

  parts = significandParts();

  assert(semantics == rhs.semantics);
  assert(exponent == rhs.exponent);

  return APInt::tcSubtract(parts, rhs.significandParts(), borrow,
                           partCount());
}